

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int bitstream_r_memcpy(bitstream_r *stream,void *dst,size_t bytes)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = stream->bit_offset;
  if ((uVar2 & 7) != 0) {
    uVar2 = (uVar2 & 0xfffffffffffffff8) + 8;
    stream->bit_offset = uVar2;
  }
  if (stream->length < (uVar2 >> 3) + bytes) {
    iVar1 = -1;
  }
  else {
    memcpy(dst,(void *)((uVar2 >> 3) + (long)stream->ptr),bytes);
    stream->bit_offset = stream->bit_offset + bytes * 8;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
bitstream_r_memcpy(struct bitstream_r *stream, void *dst, size_t bytes) {
  const uint8_t *buffer;
  size_t offset;
  bitstream_r_pad(stream);

  offset = stream->bit_offset / 8;
  if (offset + bytes > stream->length) {
    return -1;
  }

  buffer = stream->ptr;
  memcpy(dst, &buffer[offset], bytes);

  stream->bit_offset += bytes * 8;
  return 0;
}